

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SDMMCSimulationDataGenerator::CreateCommand
          (SDMMCSimulationDataGenerator *this,uint index,unsigned_long arg)

{
  SimulationChannelDescriptor *pSVar1;
  int iVar2;
  U8 crc_data [5];
  BitExtractor bits;
  U8 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  BitExtractor local_38 [8];
  
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar2 != 1) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  }
  iVar2 = 0x28;
  BitExtractor::BitExtractor(local_38,(ulong)index << 0x20 | arg | 0x4000000000,MsbFirst,0x28);
  do {
    pSVar1 = this->mCommand;
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar1);
    CreateClockPeriod(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  local_3d = (char)index + '@';
  local_3c = (undefined1)(arg >> 0x18);
  local_3b = (undefined1)(arg >> 0x10);
  local_3a = (undefined1)(arg >> 8);
  local_39 = (undefined1)arg;
  SDMMCHelpers::crc7(&local_3d,5);
  iVar2 = 7;
  do {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
    CreateClockPeriod(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
  CreateClockPeriod(this);
  BitExtractor::~BitExtractor(local_38);
  return;
}

Assistant:

void SDMMCSimulationDataGenerator::CreateCommand(unsigned int index, unsigned long arg)
{
	U64 data =
		(0ull       << 39) | /* start bit */
		(1ull       << 38) | /* transmission bit: host */
		((U64)index << 32) | /* command index */
		((U64)arg   <<  0);  /* command argument */

	/* make sure we continue with clock as high */
	if (mClock->GetCurrentBitState() != BIT_HIGH) {
		mClock->Transition();
		mChannels.AdvanceAll(mClockGenerator.AdvanceByHalfPeriod(.5));
	}

	BitExtractor bits(data, AnalyzerEnums::MsbFirst, 40);

	for (int i = 0; i < 40; i++) {
		mCommand->TransitionIfNeeded(bits.GetNextBit());
		CreateClockPeriod();
	}

	U8 crc_data[5];

	crc_data[0] = 0x40 + (U8)index;
	crc_data[1] = arg >> 24;
	crc_data[2] = arg >> 16;
	crc_data[3] = arg >>  8;
	crc_data[4] = arg;

	U8 crc = SDMMCHelpers::crc7(crc_data, 5);

	for (int i = 0; i < 7; i++) {
		crc <<= 1;

		mCommand->TransitionIfNeeded(crc & 0x80 ? BIT_HIGH : BIT_LOW);
		CreateClockPeriod();
	}

	/* stop bit */
	mCommand->TransitionIfNeeded(BIT_HIGH);
	CreateClockPeriod();
}